

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_rs(int *ip)

{
  int iVar1;
  
  labldef(rsbase,0);
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (pass == 1) {
      loadlc(rsbase,1);
      println();
    }
    rsbase = rsbase + value;
    if (0xffff < (uint)rsbase) {
      error("Address out of range!");
      return;
    }
  }
  return;
}

Assistant:

void
do_rs(int *ip)
{
	/* define label */
	labldef(rsbase, 0);

	/* get the number of bytes to reserve */
	if (!evaluate(ip, ';'))
		return;

	/* ouput line */
	if (pass == LAST_PASS) {
		loadlc(rsbase, 1);
		println();
	}

	/* update 'rs' base */
	rsbase += value;
	if (rsbase & 0xFFFF0000)
		error("Address out of range!");
}